

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O3

void __thiscall btRigidBody::setMassProps(btRigidBody *this,btScalar mass,btVector3 *inertia)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar7 = 0.0;
  uVar5 = (this->super_btCollisionObject).m_collisionFlags;
  if ((mass != 0.0) || (NAN(mass))) {
    (this->super_btCollisionObject).m_collisionFlags = uVar5 & 0xfffffffe;
    fVar7 = 1.0 / mass;
  }
  else {
    (this->super_btCollisionObject).m_collisionFlags = uVar5 | 1;
  }
  this->m_inverseMass = fVar7;
  uVar2 = *(undefined8 *)(this->m_linearFactor).m_floats;
  uVar3 = *(undefined8 *)(this->m_gravity_acceleration).m_floats;
  auVar8._0_4_ = mass * (float)uVar3;
  auVar8._4_4_ = mass * (float)((ulong)uVar3 >> 0x20);
  auVar8._8_4_ = mass * (this->m_gravity_acceleration).m_floats[2];
  auVar8._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_gravity).m_floats = auVar8;
  fVar1 = inertia->m_floats[2];
  uVar4 = *(ulong *)inertia->m_floats;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar9 = divps(_DAT_001ee3f0,auVar9);
  *(ulong *)(this->m_invInertiaLocal).m_floats =
       CONCAT44(-(uint)((float)(uVar4 >> 0x20) != 0.0) & auVar9._4_4_,
                -(uint)((float)uVar4 != 0.0) & auVar9._0_4_);
  (this->m_invInertiaLocal).m_floats[2] = (btScalar)(-(uint)(fVar1 != 0.0) & (uint)(1.0 / fVar1));
  (this->m_invInertiaLocal).m_floats[3] = 0.0;
  auVar6._4_4_ = fVar7 * (float)((ulong)uVar2 >> 0x20);
  auVar6._0_4_ = fVar7 * (float)uVar2;
  auVar6._8_4_ = fVar7 * (this->m_linearFactor).m_floats[2];
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_invMass).m_floats = auVar6;
  return;
}

Assistant:

void btRigidBody::setMassProps(btScalar mass, const btVector3& inertia)
{
	if (mass == btScalar(0.))
	{
		m_collisionFlags |= btCollisionObject::CF_STATIC_OBJECT;
		m_inverseMass = btScalar(0.);
	} else
	{
		m_collisionFlags &= (~btCollisionObject::CF_STATIC_OBJECT);
		m_inverseMass = btScalar(1.0) / mass;
	}

	//Fg = m * a
	m_gravity = mass * m_gravity_acceleration;
	
	m_invInertiaLocal.setValue(inertia.x() != btScalar(0.0) ? btScalar(1.0) / inertia.x(): btScalar(0.0),
				   inertia.y() != btScalar(0.0) ? btScalar(1.0) / inertia.y(): btScalar(0.0),
				   inertia.z() != btScalar(0.0) ? btScalar(1.0) / inertia.z(): btScalar(0.0));

	m_invMass = m_linearFactor*m_inverseMass;
}